

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int handle_transport_close_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  ptls_iovec_t reason_phrase;
  uint8_t **in_RSI;
  int ret;
  quicly_transport_close_frame_t frame;
  uint64_t in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  quicly_conn_t *in_stack_ffffffffffffffd8;
  uint8_t *in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  local_4 = quicly_decode_transport_close_frame
                      (in_RSI,in_stack_ffffffffffffffe0,
                       (quicly_transport_close_frame_t *)in_stack_ffffffffffffffd8);
  if (local_4 == 0) {
    reason_phrase.len = (size_t)in_RSI;
    reason_phrase.base = in_stack_ffffffffffffffe0;
    local_4 = handle_close(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                           in_stack_ffffffffffffffc8,reason_phrase);
  }
  return local_4;
}

Assistant:

static int handle_transport_close_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_transport_close_frame_t frame;
    int ret;

    if ((ret = quicly_decode_transport_close_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    QUICLY_PROBE(TRANSPORT_CLOSE_RECEIVE, conn, conn->stash.now, frame.error_code, frame.frame_type,
                 QUICLY_PROBE_ESCAPE_UNSAFE_STRING(frame.reason_phrase.base, frame.reason_phrase.len));
    return handle_close(conn, QUICLY_ERROR_FROM_TRANSPORT_ERROR_CODE(frame.error_code), frame.frame_type, frame.reason_phrase);
}